

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

bool __thiscall Assimp::D3MF::D3MFExporter::exportRelations(D3MFExporter *this)

{
  ulong uVar1;
  size_type sVar2;
  reference ppOVar3;
  char *pcVar4;
  ostream *poVar5;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ulong local_18;
  size_t i;
  D3MFExporter *this_local;
  
  i = (size_t)this;
  std::ios::clear(&this->mRelOutput + *(long *)(*(long *)&this->mRelOutput + -0x18),0);
  std::operator<<((ostream *)&this->mRelOutput,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>");
  std::ostream::operator<<(&this->mRelOutput,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&this->mRelOutput,
                  "<Relationships xmlns=\"http://schemas.openxmlformats.org/package/2006/relationships\">"
                 );
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    sVar2 = std::
            vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
            ::size(&this->mRelations);
    if (sVar2 <= uVar1) break;
    ppOVar3 = std::
              vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
              ::operator[](&this->mRelations,local_18);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&(*ppOVar3)->target);
    if (*pcVar4 == '/') {
      poVar5 = std::operator<<((ostream *)&this->mRelOutput,"<Relationship Target=\"");
      ppOVar3 = std::
                vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                ::operator[](&this->mRelations,local_18);
      poVar5 = std::operator<<(poVar5,(string *)&(*ppOVar3)->target);
      std::operator<<(poVar5,"\" ");
    }
    else {
      poVar5 = std::operator<<((ostream *)&this->mRelOutput,"<Relationship Target=\"/");
      ppOVar3 = std::
                vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                ::operator[](&this->mRelations,local_18);
      poVar5 = std::operator<<(poVar5,(string *)&(*ppOVar3)->target);
      std::operator<<(poVar5,"\" ");
    }
    poVar5 = std::operator<<((ostream *)&this->mRelOutput,"Id=\"");
    ppOVar3 = std::
              vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
              ::operator[](&this->mRelations,local_18);
    poVar5 = std::operator<<(poVar5,(string *)*ppOVar3);
    std::operator<<(poVar5,"\" ");
    poVar5 = std::operator<<((ostream *)&this->mRelOutput,"Type=\"");
    ppOVar3 = std::
              vector<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
              ::operator[](&this->mRelations,local_18);
    poVar5 = std::operator<<(poVar5,(string *)&(*ppOVar3)->type);
    std::operator<<(poVar5,"\" />");
    std::ostream::operator<<(&this->mRelOutput,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
  }
  std::operator<<((ostream *)&this->mRelOutput,"</Relationships>");
  std::ostream::operator<<(&this->mRelOutput,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"_rels",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,".rels",&local_71);
  writeRelInfoToFile(this,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::ostream::flush();
  return true;
}

Assistant:

bool D3MFExporter::exportRelations() {
    mRelOutput.clear();

    mRelOutput << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>";
    mRelOutput << std::endl;
    mRelOutput << "<Relationships xmlns=\"http://schemas.openxmlformats.org/package/2006/relationships\">";

    for ( size_t i = 0; i < mRelations.size(); ++i ) {
        if ( mRelations[ i ]->target[ 0 ] == '/' ) {
            mRelOutput << "<Relationship Target=\"" << mRelations[ i ]->target << "\" ";
        } else {
            mRelOutput << "<Relationship Target=\"/" << mRelations[ i ]->target << "\" ";
        }
        mRelOutput << "Id=\"" << mRelations[i]->id << "\" ";
        mRelOutput << "Type=\"" << mRelations[ i ]->type << "\" />";
        mRelOutput << std::endl;
    }
    mRelOutput << "</Relationships>";
    mRelOutput << std::endl;

    writeRelInfoToFile( "_rels", ".rels" );
    mRelOutput.flush();

    return true;
}